

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# cmOrderDirectories.cxx
# Opt level: O0

void __thiscall cmOrderDirectories::FindImplicitConflicts(cmOrderDirectories *this)

{
  size_type sVar1;
  reference ppcVar2;
  ulong uVar3;
  ostream *poVar4;
  string *psVar5;
  cmake *this_00;
  cmListFileBacktrace local_3a0;
  string local_360;
  undefined1 local_340 [8];
  ostringstream w;
  string local_1c0 [8];
  string text;
  uint local_18c;
  ostringstream local_188 [4];
  uint i;
  ostringstream conflicts;
  cmOrderDirectories *this_local;
  
  std::__cxx11::ostringstream::ostringstream(local_188);
  for (local_18c = 0;
      sVar1 = std::
              vector<cmOrderDirectoriesConstraint_*,_std::allocator<cmOrderDirectoriesConstraint_*>_>
              ::size(&this->ImplicitDirEntries), local_18c < sVar1; local_18c = local_18c + 1) {
    ppcVar2 = std::
              vector<cmOrderDirectoriesConstraint_*,_std::allocator<cmOrderDirectoriesConstraint_*>_>
              ::operator[](&this->ImplicitDirEntries,(ulong)local_18c);
    cmOrderDirectoriesConstraint::FindImplicitConflicts(*ppcVar2,(ostringstream *)local_188);
  }
  std::__cxx11::ostringstream::str();
  uVar3 = std::__cxx11::string::empty();
  if ((uVar3 & 1) == 0) {
    std::__cxx11::ostringstream::ostringstream((ostringstream *)local_340);
    poVar4 = std::operator<<((ostream *)local_340,"Cannot generate a safe ");
    poVar4 = std::operator<<(poVar4,(string *)&this->Purpose);
    poVar4 = std::operator<<(poVar4," for target ");
    psVar5 = cmGeneratorTarget::GetName_abi_cxx11_(this->Target);
    poVar4 = std::operator<<(poVar4,(string *)psVar5);
    poVar4 = std::operator<<(poVar4," because files in some directories may conflict with ");
    poVar4 = std::operator<<(poVar4," libraries in implicit directories:\n");
    poVar4 = std::operator<<(poVar4,local_1c0);
    std::operator<<(poVar4,"Some of these libraries may not be found correctly.");
    this_00 = cmGlobalGenerator::GetCMakeInstance(this->GlobalGenerator);
    std::__cxx11::ostringstream::str();
    cmGeneratorTarget::GetBacktrace(&local_3a0,this->Target);
    cmake::IssueMessage(this_00,WARNING,&local_360,&local_3a0,false);
    cmListFileBacktrace::~cmListFileBacktrace(&local_3a0);
    std::__cxx11::string::~string((string *)&local_360);
    std::__cxx11::ostringstream::~ostringstream((ostringstream *)local_340);
  }
  std::__cxx11::string::~string(local_1c0);
  std::__cxx11::ostringstream::~ostringstream(local_188);
  return;
}

Assistant:

void cmOrderDirectories::FindImplicitConflicts()
{
  // Check for items in implicit link directories that have conflicts
  // in the explicit directories.
  std::ostringstream conflicts;
  for(unsigned int i=0; i < this->ImplicitDirEntries.size(); ++i)
    {
    this->ImplicitDirEntries[i]->FindImplicitConflicts(conflicts);
    }

  // Skip warning if there were no conflicts.
  std::string text = conflicts.str();
  if(text.empty())
    {
    return;
    }

  // Warn about the conflicts.
  std::ostringstream w;
  w << "Cannot generate a safe " << this->Purpose
    << " for target " << this->Target->GetName()
    << " because files in some directories may conflict with "
    << " libraries in implicit directories:\n"
    << text
    << "Some of these libraries may not be found correctly.";
  this->GlobalGenerator->GetCMakeInstance()
    ->IssueMessage(cmake::WARNING, w.str(),
                   this->Target->GetBacktrace());
}